

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O3

void Frc_ManPlaceDfs(Frc_Man_t *p,Vec_Int_t *vCoOrder)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  byte *pbVar7;
  int local_2c;
  
  iVar1 = p->nObjData;
  if (iVar1 < 1) {
LAB_00740313:
    local_2c = 0;
  }
  else {
    piVar4 = p->pObjData;
    iVar5 = 0;
    local_2c = 0;
    do {
      if (piVar4 == (int *)0x0) goto LAB_00740313;
      uVar2 = piVar4[iVar5];
      iVar3 = piVar4[(long)iVar5 + 1];
      piVar4[(long)iVar5 + 2] = iVar3;
      if ((uVar2 & 2) == 0 && iVar3 == 0) {
        piVar4[(long)iVar5 + 4] = local_2c;
        local_2c = local_2c + 1;
      }
      iVar5 = iVar5 + iVar3 + (uVar2 >> 4) + 6;
    } while (iVar5 < iVar1);
  }
  if ((0 < vCoOrder->nSize) && (p->pObjData != (int *)0x0)) {
    pbVar7 = (byte *)(p->pObjData + *vCoOrder->pArray);
    lVar6 = 1;
    do {
      if ((*pbVar7 & 2) == 0) {
        __assert_fail("Frc_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                      ,0x343,"void Frc_ManPlaceDfs(Frc_Man_t *, Vec_Int_t *)");
      }
      Frc_ManPlaceDfs_rec(p,(Frc_Obj_t *)(pbVar7 + (long)*(int *)(pbVar7 + 0x18) * -4),&local_2c);
      iVar1 = local_2c + 1;
      *(int *)(pbVar7 + 0x10) = local_2c;
      local_2c = iVar1;
      if (vCoOrder->nSize <= lVar6) break;
      pbVar7 = (byte *)(p->pObjData + vCoOrder->pArray[lVar6]);
      lVar6 = lVar6 + 1;
    } while (p->pObjData != (int *)0x0);
  }
  if (local_2c != p->nObjs) {
    __assert_fail("nPlaces == p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                  ,0x347,"void Frc_ManPlaceDfs(Frc_Man_t *, Vec_Int_t *)");
  }
  return;
}

Assistant:

void Frc_ManPlaceDfs( Frc_Man_t * p, Vec_Int_t * vCoOrder )
{
    Frc_Obj_t * pObj;
    int i, nPlaces = 0;
    Frc_ManForEachObj( p, pObj, i )
    {
        pObj->iFanout = pObj->nFanouts;
        if ( pObj->nFanouts == 0 && !Frc_ObjIsCo(pObj) )
            pObj->pPlace = nPlaces++;
    }
    Frc_ManForEachObjVec( vCoOrder, p, pObj, i )
    {
        assert( Frc_ObjIsCo(pObj) );
        Frc_ManPlaceDfs_rec( p, Frc_ObjFanin(pObj,0), &nPlaces );
        pObj->pPlace = nPlaces++;
    }
    assert( nPlaces == p->nObjs );
}